

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  MethodOptions *mutable_options;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar1 = Consume(this,"rpc");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&local_40,method_location,1);
    LocationRecorder::RecordLegacyLocation(&local_40,&method->super_Message,NAME);
    *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 1;
    if ((method->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&method->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    bVar1 = ConsumeIdentifier(this,(method->name_).ptr_,"Expected method name.");
    LocationRecorder::~LocationRecorder(&local_40);
    if ((bVar1) && (bVar1 = Consume(this,"("), bVar1)) {
      iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar2 == 0) {
        LocationRecorder::LocationRecorder(&local_40,method_location,5);
        LocationRecorder::RecordLegacyLocation(&local_40,&method->super_Message,OTHER);
        *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x10;
        method->client_streaming_ = true;
        bVar1 = Consume(this,"stream");
        LocationRecorder::~LocationRecorder(&local_40);
        if (!bVar1) {
          return false;
        }
      }
      LocationRecorder::LocationRecorder(&local_40,method_location,2);
      LocationRecorder::RecordLegacyLocation(&local_40,&method->super_Message,INPUT_TYPE);
      *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 2;
      if ((method->input_type_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (&method->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar1 = ParseUserDefinedType(this,(method->input_type_).ptr_);
      LocationRecorder::~LocationRecorder(&local_40);
      if ((((bVar1) && (bVar1 = Consume(this,")"), bVar1)) &&
          (bVar1 = Consume(this,"returns"), bVar1)) && (bVar1 = Consume(this,"("), bVar1)) {
        iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar2 == 0) {
          LocationRecorder::LocationRecorder(&local_40,method_location,6);
          LocationRecorder::RecordLegacyLocation(&local_40,&method->super_Message,OTHER);
          bVar1 = Consume(this,"stream");
          if (!bVar1) {
            LocationRecorder::~LocationRecorder(&local_40);
            return false;
          }
          *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x20;
          method->server_streaming_ = true;
          LocationRecorder::~LocationRecorder(&local_40);
        }
        LocationRecorder::LocationRecorder(&local_40,method_location,3);
        LocationRecorder::RecordLegacyLocation(&local_40,&method->super_Message,OUTPUT_TYPE);
        *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 4;
        if ((method->output_type_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (&method->output_type_,
                     (string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar1 = ParseUserDefinedType(this,(method->output_type_).ptr_);
        LocationRecorder::~LocationRecorder(&local_40);
        if ((bVar1) && (bVar1 = Consume(this,")"), bVar1)) {
          iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar2 == 0) {
            mutable_options = MethodDescriptorProto::mutable_options(method);
            bVar1 = ParseMethodOptions(this,method_location,containing_file,4,
                                       &mutable_options->super_Message);
          }
          else {
            bVar1 = ConsumeEndOfDeclaration(this,";",method_location);
          }
          if (bVar1 != false) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(
          method, DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(
          method, DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}